

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConstraintBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  ConstraintBlockSymbol *thisSym_;
  
  thisSym_ = (ConstraintBlockSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintBlockSymbol *)this->endPtr < thisSym_ + 1) {
    thisSym_ = (ConstraintBlockSymbol *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(thisSym_ + 1);
  }
  sVar2 = args_1->_M_len;
  pcVar3 = args_1->_M_str;
  SVar1 = *args_2;
  (thisSym_->super_Symbol).kind = ConstraintBlock;
  (thisSym_->super_Symbol).name._M_len = sVar2;
  (thisSym_->super_Symbol).name._M_str = pcVar3;
  (thisSym_->super_Symbol).location = SVar1;
  (thisSym_->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (thisSym_->super_Symbol).parentScope = (Scope *)0x0;
  (thisSym_->super_Symbol).nextInScope = (Symbol *)0x0;
  (thisSym_->super_Symbol).indexInScope = 0;
  ast::Scope::Scope(&thisSym_->super_Scope,args,&thisSym_->super_Symbol);
  thisSym_->thisVar = (VariableSymbol *)0x0;
  (thisSym_->flags).m_bits = '\0';
  thisSym_->constraint = (Constraint *)0x0;
  thisSym_->outOfBlockIndex = 0;
  return thisSym_;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }